

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void PredictorAdd1_C(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t b;
  ulong uVar1;
  ulong uVar2;
  
  b = out[-1];
  uVar1 = 0;
  uVar2 = (ulong)(uint)num_pixels;
  if (num_pixels < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    b = VP8LAddPixels(in[uVar1],b);
    out[uVar1] = b;
  }
  return;
}

Assistant:

static void PredictorAdd1_C(const uint32_t* in, const uint32_t* upper,
                            int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  uint32_t left = out[-1];
  (void)upper;
  for (i = 0; i < num_pixels; ++i) {
    out[i] = left = VP8LAddPixels(in[i], left);
  }
}